

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidgetItem::setHidden(QTreeWidgetItem *this,bool hide)

{
  QTreeView *this_00;
  int row;
  QTreeModel *pQVar1;
  QWidget *this_01;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = treeModel(this,(QTreeWidget *)0x0);
  if (pQVar1 != (QTreeModel *)0x0) {
    if (pQVar1->headerItem == this) {
      this_01 = (QWidget *)QTreeView::header(&this->view->super_QTreeView);
      QWidget::setHidden(this_01,hide);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QTreeWidgetPrivate::index
                ((QTreeWidgetPrivate *)&local_58,
                 *(char **)&(this->view->super_QTreeView).super_QAbstractItemView.
                            super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8,(int)this
                );
      this_00 = &this->view->super_QTreeView;
      row = (int)local_58;
      QModelIndex::parent(&local_70,(QModelIndex *)&local_58);
      QTreeView::setRowHidden(this_00,row,&local_70,hide);
    }
    this->d->field_0x20 = this->d->field_0x20 & 0xfb | hide << 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::setHidden(bool hide)
{
    const QTreeModel *model = treeModel();
    if (!model)
        return;
    if (this == model->headerItem) {
        view->header()->setHidden(hide);
    } else {
        const QModelIndex index = view->d_func()->index(this);
        view->setRowHidden(index.row(), index.parent(), hide);
    }
    d->hidden = hide;
}